

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::CleanStringLineEndings(string *src,string *dst,bool auto_end_last_line)

{
  string tmp;
  string sStack_38;
  
  if (dst->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&sStack_38,(string *)src);
    CleanStringLineEndings(&sStack_38,auto_end_last_line);
    std::__cxx11::string::append((string *)dst);
    std::__cxx11::string::~string((string *)&sStack_38);
    return;
  }
  std::__cxx11::string::append((string *)dst);
  CleanStringLineEndings(dst,auto_end_last_line);
  return;
}

Assistant:

void CleanStringLineEndings(const std::string &src, std::string *dst,
                            bool auto_end_last_line) {
  if (dst->empty()) {
    dst->append(src);
    CleanStringLineEndings(dst, auto_end_last_line);
  } else {
    std::string tmp = src;
    CleanStringLineEndings(&tmp, auto_end_last_line);
    dst->append(tmp);
  }
}